

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cc
# Opt level: O0

ssize_t avro::GenericWriter::write(int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  size_t sVar4;
  GenericUnion *this;
  GenericDatum *pGVar5;
  bool *pbVar6;
  int *piVar7;
  long *plVar8;
  float *pfVar9;
  double *pdVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong extraout_RAX;
  GenericFixed *this_00;
  ulong extraout_RAX_00;
  NodePtr *this_01;
  type pNVar12;
  undefined4 extraout_var;
  GenericEnum *this_02;
  GenericArray *this_03;
  reference pGVar13;
  GenericMap *this_04;
  size_type sVar14;
  pointer ppVar15;
  undefined8 uVar16;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_05;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  size_t __n_03;
  undefined4 in_register_0000003c;
  const_iterator it_1;
  Value *r_2;
  const_iterator it;
  Value *r_1;
  size_t i;
  size_t c;
  GenericRecord *r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  GenericRecord *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *in_stack_fffffffffffffe40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe48;
  long *plVar17;
  Encoder *in_stack_fffffffffffffe50;
  format *in_stack_fffffffffffffe68;
  Exception *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe98;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
  local_50;
  Value *local_48;
  GenericDatum *local_40;
  __normal_iterator<const_avro::GenericDatum_*,_std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>_>
  local_38;
  Value *local_30;
  ulong local_28;
  ulong local_20;
  GenericRecord *local_18;
  long *local_10;
  GenericDatum *local_8;
  
  local_8 = (GenericDatum *)CONCAT44(in_register_0000003c,__fd);
  local_10 = (long *)__buf;
  bVar1 = GenericDatum::isUnion(local_8);
  plVar17 = local_10;
  if (bVar1) {
    sVar4 = GenericDatum::unionBranch((GenericDatum *)0x1d4557);
    (**(code **)(*plVar17 + 0xa0))(plVar17,sVar4);
    this = GenericDatum::value<avro::GenericUnion>((GenericDatum *)0x1d4578);
    pGVar5 = GenericUnion::datum(this);
    local_28 = write((int)pGVar5,local_10,__n_00);
  }
  else {
    TVar2 = GenericDatum::type(local_8);
    plVar17 = local_10;
    switch(TVar2) {
    case AVRO_STRING:
      pbVar11 = GenericDatum::value<std::__cxx11::string>((GenericDatum *)0x1d46e1);
      local_28 = (**(code **)(*plVar17 + 0x50))(plVar17,pbVar11);
      break;
    case AVRO_BYTES:
      GenericDatum::value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((GenericDatum *)0x1d470e);
      Encoder::encodeBytes(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_28 = extraout_RAX;
      break;
    case AVRO_INT:
      piVar7 = GenericDatum::value<int>((GenericDatum *)0x1d462c);
      local_28 = (**(code **)(*plVar17 + 0x30))(plVar17,*piVar7);
      break;
    case AVRO_LONG:
      plVar8 = GenericDatum::value<long>((GenericDatum *)0x1d4658);
      local_28 = (**(code **)(*plVar17 + 0x38))(plVar17,*plVar8);
      break;
    case AVRO_FLOAT:
      pfVar9 = GenericDatum::value<float>((GenericDatum *)0x1d4685);
      local_28 = (**(code **)(*plVar17 + 0x40))(*pfVar9);
      break;
    case AVRO_DOUBLE:
      pdVar10 = GenericDatum::value<double>((GenericDatum *)0x1d46b3);
      local_28 = (**(code **)(*plVar17 + 0x48))(*pdVar10);
      break;
    case AVRO_BOOL:
      pbVar6 = GenericDatum::value<bool>((GenericDatum *)0x1d45fa);
      local_28 = (**(code **)(*plVar17 + 0x28))(plVar17,*pbVar6 & 1);
      break;
    case AVRO_NULL:
      local_28 = (**(code **)(*local_10 + 0x20))();
      break;
    case AVRO_RECORD:
      local_18 = GenericDatum::value<avro::GenericRecord>((GenericDatum *)0x1d4761);
      this_01 = GenericContainer::schema(&local_18->super_GenericContainer);
      pNVar12 = boost::shared_ptr<avro::Node>::operator->(this_01);
      iVar3 = (*pNVar12->_vptr_Node[4])();
      local_20 = CONCAT44(extraout_var,iVar3);
      for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
        pGVar5 = GenericRecord::fieldAt(in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28)
        ;
        write((int)pGVar5,local_10,__n_01);
      }
      break;
    case AVRO_ENUM:
      this_02 = GenericDatum::value<avro::GenericEnum>((GenericDatum *)0x1d4807);
      sVar4 = GenericEnum::value(this_02);
      local_28 = (**(code **)(*plVar17 + 0x68))(plVar17,sVar4);
      break;
    case AVRO_ARRAY:
      this_03 = GenericDatum::value<avro::GenericArray>((GenericDatum *)0x1d482f);
      local_30 = GenericArray::value(this_03);
      (**(code **)(*local_10 + 0x70))();
      bVar1 = std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::empty
                        (in_stack_fffffffffffffe40);
      plVar17 = local_10;
      if (!bVar1) {
        sVar14 = std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::size
                           (local_30);
        (**(code **)(*plVar17 + 0x90))(plVar17,sVar14);
        local_38._M_current =
             (GenericDatum *)
             std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::begin
                       ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)
                        in_stack_fffffffffffffe28);
        while( true ) {
          local_40 = (GenericDatum *)
                     std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::end
                               ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)
                                in_stack_fffffffffffffe28);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_avro::GenericDatum_*,_std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>_>
                              *)in_stack_fffffffffffffe30,
                             (__normal_iterator<const_avro::GenericDatum_*,_std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>_>
                              *)in_stack_fffffffffffffe28);
          if (!bVar1) break;
          (**(code **)(*local_10 + 0x98))();
          pGVar13 = __gnu_cxx::
                    __normal_iterator<const_avro::GenericDatum_*,_std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>_>
                    ::operator*(&local_38);
          write((int)pGVar13,local_10,__n_02);
          __gnu_cxx::
          __normal_iterator<const_avro::GenericDatum_*,_std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>_>
          ::operator++(&local_38);
        }
      }
      local_28 = (**(code **)(*local_10 + 0x78))();
      break;
    case AVRO_MAP:
      this_04 = GenericDatum::value<avro::GenericMap>((GenericDatum *)0x1d4931);
      local_48 = GenericMap::value_abi_cxx11_(this_04);
      (**(code **)(*local_10 + 0x80))();
      bVar1 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
              ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                       *)in_stack_fffffffffffffe40);
      if (!bVar1) {
        plVar17 = local_10;
        sVar14 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                 ::size(local_48);
        (**(code **)(*plVar17 + 0x90))(plVar17,sVar14);
        local_50._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                         *)in_stack_fffffffffffffe28);
        while( true ) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                 *)in_stack_fffffffffffffe28);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
                              *)in_stack_fffffffffffffe30,
                             (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
                              *)in_stack_fffffffffffffe28);
          if (!bVar1) break;
          (**(code **)(*local_10 + 0x98))();
          plVar17 = local_10;
          ppVar15 = __gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
                    ::operator->(&local_50);
          (**(code **)(*plVar17 + 0x50))(plVar17,ppVar15);
          ppVar15 = __gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
                    ::operator->(&local_50);
          write((int)ppVar15 + 0x20,local_10,__n_03);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>_>
          ::operator++(&local_50);
        }
      }
      local_28 = (**(code **)(*local_10 + 0x88))();
      break;
    default:
      uVar16 = __cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      TVar2 = GenericDatum::type(local_8);
      this_05 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                toString_abi_cxx11_(TVar2);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                (this_05,in_stack_fffffffffffffe28);
      Exception::Exception(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_throw(uVar16,&Exception::typeinfo,Exception::~Exception);
    case AVRO_FIXED:
      this_00 = GenericDatum::value<avro::GenericFixed>((GenericDatum *)0x1d473a);
      GenericFixed::value(this_00);
      Encoder::encodeFixed
                ((Encoder *)in_stack_fffffffffffffe40,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      local_28 = extraout_RAX_00;
    }
  }
  return local_28;
}

Assistant:

void GenericWriter::write(const GenericDatum& datum, Encoder& e)
{
    if (datum.isUnion()) {
        e.encodeUnionIndex(datum.unionBranch());
        write(datum.value<GenericUnion>().datum(), e);
        return;
    }
    switch (datum.type()) {
    case AVRO_NULL:
        e.encodeNull();
        break;
    case AVRO_BOOL:
        e.encodeBool(datum.value<bool>());
        break;
    case AVRO_INT:
        e.encodeInt(datum.value<int32_t>());
        break;
    case AVRO_LONG:
        e.encodeLong(datum.value<int64_t>());
        break;
    case AVRO_FLOAT:
        e.encodeFloat(datum.value<float>());
        break;
    case AVRO_DOUBLE:
        e.encodeDouble(datum.value<double>());
        break;
    case AVRO_STRING:
        e.encodeString(datum.value<string>());
        break;
    case AVRO_BYTES:
        e.encodeBytes(datum.value<bytes>());
        break;
    case AVRO_FIXED:
        e.encodeFixed(datum.value<GenericFixed>().value());
        break;
    case AVRO_RECORD:
        {
            const GenericRecord& r = datum.value<GenericRecord>();
            size_t c = r.schema()->leaves();
            for (size_t i = 0; i < c; ++i) {
                write(r.fieldAt(i), e);
            }
        }
        break;
    case AVRO_ENUM:
        e.encodeEnum(datum.value<GenericEnum>().value());
        break;
    case AVRO_ARRAY:
        {
            const GenericArray::Value& r = datum.value<GenericArray>().value();
            e.arrayStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericArray::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    write(*it, e);
                }
            }
            e.arrayEnd();
        }
        break;
    case AVRO_MAP:
        {
            const GenericMap::Value& r = datum.value<GenericMap>().value();
            e.mapStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericMap::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    e.encodeString(it->first);
                    write(it->second, e);
                }
            }
            e.mapEnd();
        }
        break;
    default:
        throw Exception(boost::format("Unknown schema type %1%") %
            toString(datum.type()));
    }
}